

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void RenderArrowsForVerticalBar
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,float bar_w,float alpha)

{
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 pos_03;
  ImVec2 half_sz_00;
  ImVec2 half_sz_01;
  ImU32 col;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = half_sz.x;
  fVar2 = pos.y;
  fVar1 = 1.0;
  if (alpha <= 1.0) {
    fVar1 = alpha;
  }
  fVar4 = pos.x + fVar3;
  fVar5 = half_sz.y + 1.0;
  col = (int)((float)(~-(uint)(alpha < 0.0) & (uint)fVar1) * 255.0 + 0.5) * 0x1000000;
  pos_00.y = fVar2;
  pos_00.x = fVar4 + 1.0;
  half_sz_00.y = fVar5;
  half_sz_00.x = fVar3 + 2.0;
  ImGui::RenderArrowPointingAt(draw_list,pos_00,half_sz_00,1,col);
  pos_01.y = fVar2;
  pos_01.x = fVar4;
  ImGui::RenderArrowPointingAt(draw_list,pos_01,half_sz,1,col + 0xffffff);
  fVar1 = (bar_w + pos.x) - fVar3;
  half_sz_01.y = fVar5;
  half_sz_01.x = fVar3 + 2.0;
  pos_02.y = fVar2;
  pos_02.x = fVar1 + -1.0;
  ImGui::RenderArrowPointingAt(draw_list,pos_02,half_sz_01,0,col);
  pos_03.y = fVar2;
  pos_03.x = fVar1;
  ImGui::RenderArrowPointingAt(draw_list,pos_03,half_sz,0,col + 0xffffff);
  return;
}

Assistant:

static void RenderArrowsForVerticalBar(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, float bar_w, float alpha)
{
    ImU32 alpha8 = IM_F32_TO_INT8_SAT(alpha);
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x + 1,         pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Right, IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + half_sz.x,             pos.y), half_sz,                              ImGuiDir_Right, IM_COL32(255,255,255,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x - 1, pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Left,  IM_COL32(0,0,0,alpha8));
    ImGui::RenderArrowPointingAt(draw_list, ImVec2(pos.x + bar_w - half_sz.x,     pos.y), half_sz,                              ImGuiDir_Left,  IM_COL32(255,255,255,alpha8));
}